

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void wasm::Literal::printFloat(ostream *o,float f)

{
  uint32_t uVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if (!NAN(f)) {
    printDouble(o,(double)f);
    return;
  }
  pcVar3 = "";
  if ((int)f < 0) {
    pcVar3 = "-";
  }
  poVar2 = std::operator<<(o,pcVar3);
  std::operator<<(poVar2,"nan");
  uVar1 = NaNPayload(f);
  if (uVar1 != 0) {
    poVar2 = std::operator<<(o,":0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  return;
}

Assistant:

void Literal::printFloat(std::ostream& o, float f) {
  if (std::isnan(f)) {
    const char* sign = std::signbit(f) ? "-" : "";
    o << sign << "nan";
    if (uint32_t payload = NaNPayload(f)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  printDouble(o, f);
}